

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunnonlinsol_newton.c
# Opt level: O0

int main(int argc,char **argv)

{
  undefined4 uVar1;
  int iVar2;
  undefined8 *__ptr;
  undefined8 uVar3;
  SUNContext sunctx;
  int retval;
  long niters;
  SUNNonlinearSolver NLS;
  IntegratorMem Imem;
  undefined4 local_38;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  void *in_stack_ffffffffffffffd8;
  int local_4;
  
  uVar1 = SUNContext_Create(0,&local_38);
  iVar2 = check_retval(in_stack_ffffffffffffffd8,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffcc);
  if (iVar2 == 0) {
    __ptr = (undefined8 *)malloc(0x38);
    uVar3 = N_VNew_Serial(3,CONCAT44(in_stack_ffffffffffffffcc,local_38));
    *__ptr = uVar3;
    iVar2 = check_retval(in_stack_ffffffffffffffd8,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffd0)
                         ,in_stack_ffffffffffffffcc);
    if (iVar2 == 0) {
      uVar3 = N_VClone(*__ptr);
      __ptr[1] = uVar3;
      iVar2 = check_retval(in_stack_ffffffffffffffd8,
                           (char *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
                           in_stack_ffffffffffffffcc);
      if (iVar2 == 0) {
        uVar3 = N_VClone(*__ptr);
        __ptr[2] = uVar3;
        iVar2 = check_retval(in_stack_ffffffffffffffd8,
                             (char *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
                             in_stack_ffffffffffffffcc);
        if (iVar2 == 0) {
          uVar3 = N_VClone(*__ptr);
          __ptr[3] = uVar3;
          iVar2 = check_retval(in_stack_ffffffffffffffd8,
                               (char *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
                               in_stack_ffffffffffffffcc);
          if (iVar2 == 0) {
            uVar3 = N_VClone(*__ptr);
            __ptr[4] = uVar3;
            iVar2 = check_retval(in_stack_ffffffffffffffd8,
                                 (char *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
                                 in_stack_ffffffffffffffcc);
            if (iVar2 == 0) {
              **(undefined8 **)(*(long *)*__ptr + 0x10) = 0x3fe0000000000000;
              *(undefined8 *)(*(long *)(*(long *)*__ptr + 0x10) + 8) = 0x3fe0000000000000;
              *(undefined8 *)(*(long *)(*(long *)*__ptr + 0x10) + 0x10) = 0x3fe0000000000000;
              **(undefined8 **)(*(long *)__ptr[2] + 0x10) = 0;
              *(undefined8 *)(*(long *)(*(long *)__ptr[2] + 0x10) + 8) = 0;
              *(undefined8 *)(*(long *)(*(long *)__ptr[2] + 0x10) + 0x10) = 0;
              **(undefined8 **)(*(long *)__ptr[3] + 0x10) = 0x3ff0000000000000;
              *(undefined8 *)(*(long *)(*(long *)__ptr[3] + 0x10) + 8) = 0x3ff0000000000000;
              *(undefined8 *)(*(long *)(*(long *)__ptr[3] + 0x10) + 0x10) = 0x3ff0000000000000;
              uVar3 = SUNDenseMatrix(3,3,CONCAT44(in_stack_ffffffffffffffcc,local_38));
              __ptr[5] = uVar3;
              iVar2 = check_retval(in_stack_ffffffffffffffd8,
                                   (char *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
                                   in_stack_ffffffffffffffcc);
              if (iVar2 == 0) {
                uVar3 = SUNLinSol_Dense(*__ptr,__ptr[5],CONCAT44(in_stack_ffffffffffffffcc,local_38)
                                       );
                __ptr[6] = uVar3;
                iVar2 = check_retval(in_stack_ffffffffffffffd8,
                                     (char *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
                                     in_stack_ffffffffffffffcc);
                if (iVar2 == 0) {
                  uVar1 = SUNLinSolInitialize(__ptr[6]);
                  iVar2 = check_retval(in_stack_ffffffffffffffd8,
                                       (char *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
                                       in_stack_ffffffffffffffcc);
                  if (iVar2 == 0) {
                    uVar3 = SUNNonlinSol_Newton(*__ptr,CONCAT44(in_stack_ffffffffffffffcc,local_38))
                    ;
                    iVar2 = check_retval(in_stack_ffffffffffffffd8,
                                         (char *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
                                         in_stack_ffffffffffffffcc);
                    if (iVar2 == 0) {
                      uVar1 = SUNNonlinSolSetSysFn(uVar3,Res);
                      iVar2 = check_retval(in_stack_ffffffffffffffd8,
                                           (char *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
                                           in_stack_ffffffffffffffcc);
                      if (iVar2 == 0) {
                        uVar1 = SUNNonlinSolSetLSetupFn(uVar3,LSetup);
                        iVar2 = check_retval(in_stack_ffffffffffffffd8,
                                             (char *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
                                             in_stack_ffffffffffffffcc);
                        if (iVar2 == 0) {
                          uVar1 = SUNNonlinSolSetLSolveFn(uVar3,LSolve);
                          iVar2 = check_retval(in_stack_ffffffffffffffd8,
                                               (char *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
                                               in_stack_ffffffffffffffcc);
                          if (iVar2 == 0) {
                            uVar1 = SUNNonlinSolSetConvTestFn(uVar3,ConvTest,0);
                            iVar2 = check_retval(in_stack_ffffffffffffffd8,
                                                 (char *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
                                                 in_stack_ffffffffffffffcc);
                            if (iVar2 == 0) {
                              uVar1 = SUNNonlinSolSetMaxIters(uVar3,10);
                              iVar2 = check_retval(in_stack_ffffffffffffffd8,
                                                   (char *)CONCAT44(uVar1,in_stack_ffffffffffffffd0)
                                                   ,in_stack_ffffffffffffffcc);
                              if (iVar2 == 0) {
                                uVar1 = SUNNonlinSolSolve(0x3f847ae147ae147b,uVar3,*__ptr,__ptr[2],
                                                          __ptr[3],1,__ptr);
                                iVar2 = check_retval(in_stack_ffffffffffffffd8,
                                                     (char *)CONCAT44(uVar1,
                                                  in_stack_ffffffffffffffd0),
                                                  in_stack_ffffffffffffffcc);
                                if (iVar2 == 0) {
                                  N_VLinearSum(0x3ff0000000000000,*__ptr,__ptr[2],__ptr[1]);
                                  printf("Solution:\n");
                                  printf("y1 = %g\n",**(undefined8 **)(*(long *)__ptr[1] + 0x10));
                                  printf("y2 = %g\n",
                                         *(undefined8 *)(*(long *)(*(long *)__ptr[1] + 0x10) + 8));
                                  printf("y3 = %g\n",
                                         *(undefined8 *)(*(long *)(*(long *)__ptr[1] + 0x10) + 0x10)
                                        );
                                  printf("Solution Error:\n");
                                  printf("e1 = %g\n",
                                         **(double **)(*(long *)__ptr[1] + 0x10) -
                                         0.7851969330623553);
                                  printf("e2 = %g\n",
                                         *(double *)(*(long *)(*(long *)__ptr[1] + 0x10) + 8) -
                                         0.4966113929446564);
                                  printf("e3 = %g\n",
                                         *(double *)(*(long *)(*(long *)__ptr[1] + 0x10) + 0x10) -
                                         0.36992283074587234);
                                  local_4 = SUNNonlinSolGetNumIters(uVar3,&stack0xffffffffffffffd8);
                                  iVar2 = check_retval(in_stack_ffffffffffffffd8,
                                                       (char *)CONCAT44(local_4,
                                                  in_stack_ffffffffffffffd0),
                                                  in_stack_ffffffffffffffcc);
                                  if (iVar2 == 0) {
                                    printf("Number of nonlinear iterations: %ld\n",
                                           in_stack_ffffffffffffffd8);
                                    N_VDestroy(*__ptr);
                                    N_VDestroy(__ptr[1]);
                                    N_VDestroy(__ptr[2]);
                                    N_VDestroy(__ptr[3]);
                                    N_VDestroy(__ptr[4]);
                                    SUNMatDestroy(__ptr[5]);
                                    SUNLinSolFree(__ptr[6]);
                                    SUNNonlinSolFree(uVar3);
                                    free(__ptr);
                                    SUNContext_Free(&local_38);
                                    if (local_4 == 0) {
                                      printf("SUCCESS\n");
                                    }
                                    else {
                                      printf("FAIL\n");
                                    }
                                  }
                                  else {
                                    local_4 = 1;
                                  }
                                }
                                else {
                                  local_4 = 1;
                                }
                              }
                              else {
                                local_4 = 1;
                              }
                            }
                            else {
                              local_4 = 1;
                            }
                          }
                          else {
                            local_4 = 1;
                          }
                        }
                        else {
                          local_4 = 1;
                        }
                      }
                      else {
                        local_4 = 1;
                      }
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
  IntegratorMem Imem;     /* proxy for integrator memory */
  SUNNonlinearSolver NLS; /* nonlinear solver object     */
  long int niters;        /* number of nonlinear iters   */
  int retval = 0;         /* return value                */
  SUNContext sunctx;

  /* create SUNDIALS context */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* create proxy for integrator memory */
  Imem = (IntegratorMem)malloc(sizeof(struct IntegratorMemRec));

  /* create vector */
  Imem->y0 = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)Imem->y0, "N_VNew_Serial", 0)) { return (1); }

  Imem->ycur = N_VClone(Imem->y0);
  if (check_retval((void*)Imem->ycur, "N_VClone", 0)) { return (1); }

  Imem->ycor = N_VClone(Imem->y0);
  if (check_retval((void*)Imem->ycor, "N_VClone", 0)) { return (1); }

  Imem->w = N_VClone(Imem->y0);
  if (check_retval((void*)Imem->w, "N_VClone", 0)) { return (1); }

  Imem->x = N_VClone(Imem->y0);
  if (check_retval((void*)Imem->x, "N_VClone", 0)) { return (1); }

  /* set initial guess for the state */
  NV_Ith_S(Imem->y0, 0) = HALF;
  NV_Ith_S(Imem->y0, 1) = HALF;
  NV_Ith_S(Imem->y0, 2) = HALF;

  /* set initial guess for the correction */
  NV_Ith_S(Imem->ycor, 0) = ZERO;
  NV_Ith_S(Imem->ycor, 1) = ZERO;
  NV_Ith_S(Imem->ycor, 2) = ZERO;

  /* set weights for norm */
  NV_Ith_S(Imem->w, 0) = ONE;
  NV_Ith_S(Imem->w, 1) = ONE;
  NV_Ith_S(Imem->w, 2) = ONE;

  /* create dense matrix */
  Imem->A = SUNDenseMatrix(NEQ, NEQ, sunctx);
  if (check_retval((void*)Imem->A, "SUNDenseMatrix", 0)) { return (1); }

  /* create dense linear solver */
  Imem->LS = SUNLinSol_Dense(Imem->y0, Imem->A, sunctx);
  if (check_retval((void*)Imem->LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* initialize the linear solver */
  retval = SUNLinSolInitialize(Imem->LS);
  if (check_retval(&retval, "SUNLinSolInitialize", 1)) { return (1); }

  /* create nonlinear solver */
  NLS = SUNNonlinSol_Newton(Imem->y0, sunctx);
  if (check_retval((void*)NLS, "SUNNonlinSol_Newton", 0)) { return (1); }

  /* set the nonlinear residual function */
  retval = SUNNonlinSolSetSysFn(NLS, Res);
  if (check_retval(&retval, "SUNNonlinSolSetSysFn", 1)) { return (1); }

  /* set the wrapper functions to linear solver setup and solve functions */
  retval = SUNNonlinSolSetLSetupFn(NLS, LSetup);
  if (check_retval(&retval, "SUNNonlinSolSetSetupFn", 1)) { return (1); }

  retval = SUNNonlinSolSetLSolveFn(NLS, LSolve);
  if (check_retval(&retval, "SUNNonlinSolSetSolveFn", 1)) { return (1); }

  retval = SUNNonlinSolSetConvTestFn(NLS, ConvTest, NULL);
  if (check_retval(&retval, "SUNNonlinSolSetConvTestFn", 1)) { return (1); }

  /* set the maximum number of nonlinear iterations */
  retval = SUNNonlinSolSetMaxIters(NLS, MAXIT);
  if (check_retval(&retval, "SUNNonlinSolSetMaxIters", 1)) { return (1); }

  /* solve the nonlinear system */
  retval = SUNNonlinSolSolve(NLS, Imem->y0, Imem->ycor, Imem->w, TOL, SUNTRUE,
                             Imem);
  if (check_retval(&retval, "SUNNonlinSolSolve", 1)) { return (1); }

  /* update the initial guess with the final correction */
  N_VLinearSum(ONE, Imem->y0, ONE, Imem->ycor, Imem->ycur);

  /* print the solution */
  printf("Solution:\n");
  printf("y1 = %" GSYM "\n", NV_Ith_S(Imem->ycur, 0));
  printf("y2 = %" GSYM "\n", NV_Ith_S(Imem->ycur, 1));
  printf("y3 = %" GSYM "\n", NV_Ith_S(Imem->ycur, 2));

  /* print the solution error */
  printf("Solution Error:\n");
  printf("e1 = %" GSYM "\n", NV_Ith_S(Imem->ycur, 0) - Y1);
  printf("e2 = %" GSYM "\n", NV_Ith_S(Imem->ycur, 1) - Y2);
  printf("e3 = %" GSYM "\n", NV_Ith_S(Imem->ycur, 2) - Y3);

  /* get the number of linear iterations */
  retval = SUNNonlinSolGetNumIters(NLS, &niters);
  if (check_retval(&retval, "SUNNonlinSolGetNumIters", 1)) { return (1); }

  printf("Number of nonlinear iterations: %ld\n", niters);

  /* Free vector, matrix, linear solver, and nonlinear solver */
  N_VDestroy(Imem->y0);
  N_VDestroy(Imem->ycur);
  N_VDestroy(Imem->ycor);
  N_VDestroy(Imem->w);
  N_VDestroy(Imem->x);
  SUNMatDestroy(Imem->A);
  SUNLinSolFree(Imem->LS);
  SUNNonlinSolFree(NLS);
  free(Imem);
  SUNContext_Free(&sunctx);

  /* Print result */
  if (retval) { printf("FAIL\n"); }
  else { printf("SUCCESS\n"); }

  return (retval);
}